

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseVarListOpt(WastParser *this,VarVector *out_var_list)

{
  bool bVar1;
  Location local_e8;
  Var local_c8;
  Location local_80;
  undefined1 local_60 [8];
  Var var;
  VarVector *out_var_list_local;
  WastParser *this_local;
  
  var.field_2._24_8_ = out_var_list;
  Location::Location(&local_80);
  Var::Var((Var *)local_60,0xffffffff,&local_80);
  while( true ) {
    Location::Location(&local_e8);
    Var::Var(&local_c8,0xffffffff,&local_e8);
    bVar1 = ParseVarOpt(this,(Var *)local_60,&local_c8);
    Var::~Var(&local_c8);
    if (!bVar1) break;
    std::vector<wabt::Var,_std::allocator<wabt::Var>_>::push_back
              ((vector<wabt::Var,_std::allocator<wabt::Var>_> *)var.field_2._24_8_,
               (value_type *)local_60);
  }
  bVar1 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::empty
                    ((vector<wabt::Var,_std::allocator<wabt::Var>_> *)var.field_2._24_8_);
  Var::~Var((Var *)local_60);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool WastParser::ParseVarListOpt(VarVector* out_var_list) {
  WABT_TRACE(ParseVarListOpt);
  Var var;
  while (ParseVarOpt(&var))
    out_var_list->push_back(var);

  return !out_var_list->empty();
}